

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::SourceBuffer>::emplace_back<slang::SourceBuffer_const&>
          (SmallVectorBase<slang::SourceBuffer> *this,SourceBuffer *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  size_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  BufferID BVar6;
  undefined4 uVar7;
  pointer pSVar8;
  pointer pSVar9;
  pointer pSVar10;
  long lVar11;
  long lVar12;
  pointer __src;
  size_type sVar13;
  ulong uVar14;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    sVar3 = (args->data)._M_len;
    pcVar4 = (args->data)._M_str;
    BVar6.id = (args->id).id;
    uVar7 = *(undefined4 *)&args->field_0x1c;
    __src->library = args->library;
    __src->id = (BufferID)BVar6.id;
    *(undefined4 *)&__src->field_0x1c = uVar7;
    (__src->data)._M_len = sVar3;
    (__src->data)._M_str = pcVar4;
    sVar13 = this->len;
    this->len = sVar13 + 1;
    return this->data_ + sVar13;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar14 = this->len + 1;
  uVar2 = this->cap;
  if (uVar14 < uVar2 * 2) {
    uVar14 = uVar2 * 2;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    uVar14 = 0x3ffffffffffffff;
  }
  lVar12 = (long)__src - (long)this->data_;
  pSVar8 = (pointer)operator_new(uVar14 << 5);
  sVar3 = (args->data)._M_len;
  pcVar4 = (args->data)._M_str;
  uVar5 = *(undefined8 *)&args->id;
  puVar1 = (undefined8 *)((long)pSVar8 + lVar12 + 0x10);
  *puVar1 = args->library;
  puVar1[1] = uVar5;
  *(size_t *)((long)pSVar8 + lVar12) = sVar3;
  ((size_t *)((long)pSVar8 + lVar12))[1] = (size_t)pcVar4;
  p = this->data_;
  sVar13 = this->len;
  lVar11 = (long)p + (sVar13 * 0x20 - (long)__src);
  pSVar9 = p;
  pSVar10 = pSVar8;
  if (lVar11 == 0) {
    pSVar9 = pSVar8;
    pSVar10 = p;
    if (sVar13 != 0) {
      do {
        sVar3 = (pSVar10->data)._M_len;
        pcVar4 = (pSVar10->data)._M_str;
        BVar6.id = (pSVar10->id).id;
        uVar7 = *(undefined4 *)&pSVar10->field_0x1c;
        pSVar9->library = pSVar10->library;
        pSVar9->id = (BufferID)BVar6.id;
        *(undefined4 *)&pSVar9->field_0x1c = uVar7;
        (pSVar9->data)._M_len = sVar3;
        (pSVar9->data)._M_str = pcVar4;
        pSVar10 = pSVar10 + 1;
        pSVar9 = pSVar9 + 1;
      } while (pSVar10 != __src);
    }
  }
  else {
    for (; pSVar9 != __src; pSVar9 = pSVar9 + 1) {
      sVar3 = (pSVar9->data)._M_len;
      pcVar4 = (pSVar9->data)._M_str;
      BVar6.id = (pSVar9->id).id;
      uVar7 = *(undefined4 *)&pSVar9->field_0x1c;
      pSVar10->library = pSVar9->library;
      pSVar10->id = (BufferID)BVar6.id;
      *(undefined4 *)&pSVar10->field_0x1c = uVar7;
      (pSVar10->data)._M_len = sVar3;
      (pSVar10->data)._M_str = pcVar4;
      pSVar10 = pSVar10 + 1;
    }
    memcpy((void *)((long)pSVar8 + lVar12 + 0x20),__src,(lVar11 - 0x20U & 0xffffffffffffffe0) + 0x20
          );
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar13 = this->len;
  }
  this->len = sVar13 + 1;
  this->cap = uVar14;
  this->data_ = pSVar8;
  return (reference)((long)pSVar8 + lVar12);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }